

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysisFSInv.h
# Opt level: O2

MemoryObject * dg::pta::PointerAnalysisFSInv::getOrCreateMO(MemoryMapT *mm,PSNode *target)

{
  _Rb_tree_header *p_Var1;
  __uniq_ptr_impl<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_> *this;
  pointer __p;
  MemoryObject *pMVar2;
  PSNode *target_local;
  
  target_local = target;
  this = (__uniq_ptr_impl<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_> *)
         std::
         map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>
         ::operator[](mm,&target_local);
  pMVar2 = (this->_M_t).
           super__Tuple_impl<0UL,_dg::pta::MemoryObject_*,_std::default_delete<dg::pta::MemoryObject>_>
           .super__Head_base<0UL,_dg::pta::MemoryObject_*,_false>._M_head_impl;
  if (pMVar2 == (MemoryObject *)0x0) {
    __p = (pointer)operator_new(0x38);
    __p->node = target_local;
    p_Var1 = &(__p->pointsTo)._M_t._M_impl.super__Rb_tree_header;
    (__p->pointsTo)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (__p->pointsTo)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (__p->pointsTo)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    (__p->pointsTo)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    (__p->pointsTo)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    std::__uniq_ptr_impl<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>::reset
              (this,__p);
    pMVar2 = (this->_M_t).
             super__Tuple_impl<0UL,_dg::pta::MemoryObject_*,_std::default_delete<dg::pta::MemoryObject>_>
             .super__Head_base<0UL,_dg::pta::MemoryObject_*,_false>._M_head_impl;
  }
  return pMVar2;
}

Assistant:

static MemoryObject *getOrCreateMO(MemoryMapT *mm, PSNode *target) {
        std::unique_ptr<MemoryObject> &moptr = (*mm)[target];
        if (!moptr)
            moptr.reset(new MemoryObject(target));

        assert(mm->find(target) != mm->end());
        return moptr.get();
    }